

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O3

void * findrelpos234(tree234 *t,void *e,cmpfn234 cmp,int relation,int *index)

{
  uint direction;
  void *pvVar1;
  int index_00;
  uint uVar2;
  search234_state ss;
  search234_state local_58;
  
  uVar2 = 0xffffffff;
  if (1 < relation - 1U) {
    uVar2 = (uint)(relation - 3U < 2);
  }
  if (e == (void *)0x0 && (relation & 0xfffffffdU) != 1) {
    __assert_fail("!(equal_permitted && !e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/tree234.c"
                  ,0x218,"void *findrelpos234(tree234 *, void *, cmpfn234, int, int *)");
  }
  if (cmp == (cmpfn234)0x0) {
    cmp = t->cmp;
  }
  local_58._node = t->root;
  local_58._last = -1;
  local_58._base = 0;
  search234_step(&local_58,0);
  if (local_58.element != (void *)0x0) {
    do {
      pvVar1 = local_58.element;
      direction = -uVar2;
      if (e != (void *)0x0) {
        direction = (*cmp)(e,local_58.element);
      }
      if (((relation & 0xfffffffdU) != 1) && (direction == 0)) {
        if (index == (int *)0x0) {
          return pvVar1;
        }
        goto LAB_00163f0a;
      }
      if (direction == 0) {
        direction = uVar2;
      }
      search234_step(&local_58,direction);
    } while (local_58.element != (void *)0x0);
  }
  if (relation == 0) {
    pvVar1 = (void *)0x0;
  }
  else {
    index_00 = local_58.index - (uint)(relation - 1U < 2);
    pvVar1 = index234(t,index_00);
    if ((index != (int *)0x0) && (local_58.index = index_00, pvVar1 != (void *)0x0)) {
LAB_00163f0a:
      *index = local_58.index;
    }
  }
  return pvVar1;
}

Assistant:

void *findrelpos234(tree234 * t, void *e, cmpfn234 cmp,
                    int relation, int *index)
{
    search234_state ss;
    int reldir = (relation == REL234_LT || relation == REL234_LE ? -1 :
                  relation == REL234_GT || relation == REL234_GE ? +1 : 0);
    bool equal_permitted = (relation != REL234_LT && relation != REL234_GT);
    void *toret;

    /* Only LT / GT relations are permitted with a null query element. */
    assert(!(equal_permitted && !e));

    if (cmp == NULL)
        cmp = t->cmp;

    search234_start(&ss, t);
    while (ss.element) {
        int cmpret;

        if (e) {
            cmpret = cmp(e, ss.element);
        } else {
            cmpret = -reldir;          /* invent a fixed compare result */
        }

        if (cmpret == 0) {
            /*
             * We've found an element that compares exactly equal to
             * the query element.
             */
            if (equal_permitted) {
                /* If our search relation permits equality, we've
                 * finished already. */
                if (index)
                    *index = ss.index;
                return ss.element;
            } else {
                /* Otherwise, pretend this element was slightly too
                 * big/small, according to the direction of search. */
                cmpret = reldir;
            }
        }

        search234_step(&ss, cmpret);
    }

    /*
     * No element compares equal to the one we were after, but
     * ss.index indicates the index that element would have if it were
     * inserted.
     *
     * So if our search relation is EQ, we must simply return failure.
     */
    if (relation == REL234_EQ)
        return NULL;

    /*
     * Otherwise, we must do an index lookup for the previous index
     * (if we're going left - LE or LT) or this index (if we're going
     * right - GE or GT).
     */
    if (relation == REL234_LT || relation == REL234_LE) {
        ss.index--;
    }

    /*
     * We know the index of the element we want; just call index234
     * to do the rest. This will return NULL if the index is out of
     * bounds, which is exactly what we want.
     */
    toret = index234(t, ss.index);
    if (toret && index)
        *index = ss.index;
    return toret;
}